

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O2

bool __thiscall
ICM::Compiler::InstructionCreater::createNodeWhile
          (InstructionCreater *this,Node *node,Element *refelt)

{
  InstructionList *this_00;
  pointer pEVar1;
  pointer ppIVar2;
  pointer ppIVar3;
  uint_t uVar4;
  Element *this_01;
  InstructionData *pIVar5;
  size_t i;
  InstructionData *local_50;
  pointer local_48;
  Element *local_40;
  stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *local_38;
  
  local_38 = &this->LoopBreakIDs;
  local_50 = (InstructionData *)node->index;
  local_40 = refelt;
  std::deque<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&local_38->c,(unsigned_long *)&local_50);
  pEVar1 = (node->super_vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>).
           super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>._M_impl
           .super__Vector_impl_data._M_start;
  local_48 = pEVar1 + 2;
  this_00 = &this->InstList;
  ppIVar2 = (this->InstList).
            super_vector<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
            .
            super__Vector_base<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppIVar3 = (this->InstList).
            super_vector<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
            .
            super__Vector_base<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  createReferNode(this,pEVar1 + 1);
  pIVar5 = (InstructionData *)operator_new(0x28);
  pIVar5->_vptr_InstructionData = (_func_int **)0x0;
  *(undefined8 *)&pIVar5->Inst = 0;
  pIVar5[1]._vptr_InstructionData = (_func_int **)0x0;
  *(undefined8 *)&pIVar5[1].Inst = 0;
  pIVar5[2]._vptr_InstructionData = (_func_int **)0x0;
  pIVar5->Inst = jmpn;
  pIVar5->_vptr_InstructionData = (_func_int **)&PTR_getToString_abi_cxx11__00161da8;
  uVar4 = pEVar1[1].index;
  *(anon_union_4_2_4727c1b0_for_Element_0 *)&pIVar5[1]._vptr_InstructionData = pEVar1[1].field_0;
  *(uint_t *)&pIVar5[1].Inst = uVar4;
  local_50 = pIVar5;
  std::vector<ICM::Instruction::InstructionData*,std::allocator<ICM::Instruction::InstructionData*>>
  ::emplace_back<ICM::Instruction::InstructionData*>
            ((vector<ICM::Instruction::InstructionData*,std::allocator<ICM::Instruction::InstructionData*>>
              *)this_00,&local_50);
  createReferNode(this,local_48);
  local_50 = (InstructionData *)operator_new(0x18);
  local_50->_vptr_InstructionData = (_func_int **)0x0;
  *(undefined8 *)&local_50->Inst = 0;
  local_50->Inst = jump;
  local_50->_vptr_InstructionData = (_func_int **)&PTR_getToString_abi_cxx11__00161d60;
  local_50[1]._vptr_InstructionData = (_func_int **)((long)ppIVar2 - (long)ppIVar3 >> 3);
  std::vector<ICM::Instruction::InstructionData*,std::allocator<ICM::Instruction::InstructionData*>>
  ::emplace_back<ICM::Instruction::InstructionData*>
            ((vector<ICM::Instruction::InstructionData*,std::allocator<ICM::Instruction::InstructionData*>>
              *)this_00,&local_50);
  pIVar5[2]._vptr_InstructionData =
       (_func_int **)
       ((long)(this->InstList).
              super_vector<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
              .
              super__Vector_base<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->InstList).
              super_vector<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
              .
              super__Vector_base<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3);
  Instruction::InstructionList::push(this_00,nop);
  this_01 = local_40;
  ASTBase::Element::setRefer
            (local_40,((long)(this->InstList).
                             super_vector<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
                             .
                             super__Vector_base<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->InstList).
                             super_vector<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
                             .
                             super__Vector_base<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) - 1);
  i = ASTBase::Element::getRefer(this_01);
  adjustLoopBreakJump(this,i);
  std::deque<unsigned_long,_std::allocator<unsigned_long>_>::pop_back(&local_38->c);
  return true;
}

Assistant:

bool createNodeWhile(Node &node, Element &refelt) {
				LoopBreakIDs.push(node.getIndex());
				Element &Bexp = node[1];
				Element &Rdo = node[2];
				size_t Bid = NextInstID();
				createReferNode(Bexp);
				auto *jpendinst = new Insts::JumpNot();
				jpendinst->Data = ConvertToInstElement(Bexp);
				InstList.push_back(jpendinst);
				createReferNode(Rdo);
				Insts::Jump *jmp = new Insts::Jump();
				jmp->Index = Bid;
				InstList.push_back(jmp);
				jpendinst->Index = NextInstID();
				InstList.push(nop);

				refelt.setRefer(CurrInstID());
				adjustLoopBreakJump(refelt.getRefer());
				LoopBreakIDs.pop();
				return true;
			}